

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_const_val_Test::TestBody(expr_const_val_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Const *pCVar3;
  Const *pCVar4;
  char *pcVar5;
  undefined1 local_6d8 [8];
  Generator mod;
  Context c;
  AssertHelper local_30;
  AssertionResult gtest_ar;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"mod",
             (allocator<char> *)&local_30);
  pGVar2 = kratos::Context::generator
                     ((Context *)&mod.use_stmts_remove_cache_,
                      (string *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::Generator((Generator *)local_6d8,pGVar2);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  pCVar3 = kratos::Const::constant(10,4,false);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::Const::constant(10,4,true);
    }
  }
  testing::Message::Message((Message *)&c.tracked_generators_._M_h._M_single_bucket);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x74,"Expected: constant(10, 4, true) throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=
            (&local_30,(Message *)&c.tracked_generators_._M_h._M_single_bucket);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (c.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    (*(code *)(c.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
  }
  pCVar4 = kratos::Const::constant(-4,4,true);
  (*(pCVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])
            (&c.tracked_generators_._M_h._M_single_bucket,pCVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&local_30,"c0.to_string()","\"4\'hA\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c.tracked_generators_._M_h._M_single_bucket,(char (*) [5])"4\'hA");
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  if (local_30.data_._0_1_ == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&c.tracked_generators_._M_h._M_single_bucket);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x76,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)&c.tracked_generators_._M_h._M_single_bucket);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (c.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (*(code *)(c.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  (*(pCVar4->super_Var).super_IRNode._vptr_IRNode[0x1f])
            (&c.tracked_generators_._M_h._M_single_bucket,pCVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_30,"c1.to_string()","\"-4\'h4\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c.tracked_generators_._M_h._M_single_bucket,(char (*) [6])"-4\'h4");
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  if (local_30.data_._0_1_ == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&c.tracked_generators_._M_h._M_single_bucket);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)&c.tracked_generators_._M_h._M_single_bucket);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (c.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (*(code *)(c.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Generator::~Generator((Generator *)local_6d8);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, const_val) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &c0 = constant(10, 4);
    EXPECT_ANY_THROW(constant(10, 4, true));
    auto &c1 = constant(-4, 4, true);
    EXPECT_EQ(c0.to_string(), "4'hA");
    EXPECT_EQ(c1.to_string(), "-4'h4");
}